

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom.cc
# Opt level: O0

void init_once(void)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  int fd;
  ssize_t getrandom_ret;
  uint8_t dummy;
  int have_getrandom;
  
  sVar2 = boringssl_getrandom((void *)((long)&getrandom_ret + 3),1,1);
  if (sVar2 == 1) {
    getrandom_ready = 1;
    getrandom_ret._4_4_ = 1;
  }
  else if ((sVar2 == -1) && (piVar3 = __errno_location(), *piVar3 == 0xb)) {
    getrandom_ret._4_4_ = 1;
  }
  else {
    if ((sVar2 != -1) || (piVar3 = __errno_location(), *piVar3 != 0x26)) {
      perror("getrandom");
      abort();
    }
    getrandom_ret._4_4_ = 0;
  }
  if (getrandom_ret._4_4_ == 0) {
    do {
      iVar1 = open("/dev/urandom",0x80000);
      bVar4 = false;
      if (iVar1 == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    if (iVar1 < 0) {
      perror("failed to open /dev/urandom");
      abort();
    }
  }
  else {
    urandom_fd = -3;
    maybe_set_extra_getrandom_flags();
    iVar1 = urandom_fd;
  }
  urandom_fd = iVar1;
  return;
}

Assistant:

static void init_once(void) {
#if defined(USE_NR_getrandom)
  int have_getrandom;
  uint8_t dummy;
  ssize_t getrandom_ret =
      boringssl_getrandom(&dummy, sizeof(dummy), GRND_NONBLOCK);
  if (getrandom_ret == 1) {
    getrandom_ready = 1;
    have_getrandom = 1;
  } else if (getrandom_ret == -1 && errno == EAGAIN) {
    // We have getrandom, but the entropy pool has not been initialized yet.
    have_getrandom = 1;
  } else if (getrandom_ret == -1 && errno == ENOSYS) {
    // Fallthrough to using /dev/urandom, below.
    have_getrandom = 0;
  } else {
    // Other errors are fatal.
    perror("getrandom");
    abort();
  }

  if (have_getrandom) {
    urandom_fd = kHaveGetrandom;
    maybe_set_extra_getrandom_flags();
    return;
  }
#endif  // USE_NR_getrandom

  // FIPS builds must support getrandom.
  //
  // Historically, only Android FIPS builds required getrandom, while Linux FIPS
  // builds had a /dev/urandom fallback which used RNDGETENTCNT as a poor
  // approximation for getrandom's blocking behavior. This is now removed, but
  // avoid making assumptions on this removal until March 2023, in case it needs
  // to be restored. This comment can be deleted after March 2023.
#if defined(BORINGSSL_FIPS)
  perror("getrandom not found");
  abort();
#endif

  int fd;
  do {
    fd = open("/dev/urandom", O_RDONLY | O_CLOEXEC);
  } while (fd == -1 && errno == EINTR);

  if (fd < 0) {
    perror("failed to open /dev/urandom");
    abort();
  }

  urandom_fd = fd;
}